

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O0

void __thiscall MultiObjTestSolver<2>::~MultiObjTestSolver(MultiObjTestSolver<2> *this)

{
  void *in_RDI;
  
  ~MultiObjTestSolver((MultiObjTestSolver<2> *)0x234c98);
  operator_delete(in_RDI,0x308);
  return;
}

Assistant:

explicit MultiObjTestSolver()
    : mp::SolverImpl<MultiObjMockProblemBuilder>("", 0, 0, FLAGS), builder(0) {}